

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O2

void __thiscall PStruct::PStruct(PStruct *this,FName *name,PTypeBase *outer)

{
  FName local_1c;
  
  local_1c = (FName)name->Index;
  PNamedType::PNamedType(&this->super_PNamedType,&local_1c,outer);
  (this->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.super_DObject.
  _vptr_DObject = (_func_int **)&PTR_StaticType_006edf98;
  (this->Fields).Array = (PField **)0x0;
  (this->Fields).Most = 0;
  (this->Fields).Count = 0;
  FString::Format(&(this->super_PNamedType).super_PCompoundType.super_PType.mDescriptiveName,
                  "Struct<%s>",FName::NameData.NameArray[name->Index].Text);
  *(undefined4 *)
   &(this->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.super_DObject.
    field_0x24 = 0;
  this->HasNativeFields = false;
  return;
}

Assistant:

PStruct::PStruct(FName name, PTypeBase *outer)
: PNamedType(name, outer)
{
	mDescriptiveName.Format("Struct<%s>", name.GetChars());
	Size = 0;
	HasNativeFields = false;
}